

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

string * __thiscall Node::OutputNodeVarType_abi_cxx11_(string *__return_storage_ptr__,Node *this)

{
  VARTYPE VarType;
  string local_38;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((this->Type == 0x207) || (this->Type == 0x204)) {
    genname(&local_38,&this->TextValue);
  }
  else {
    VarType = GetNodeVarType(this);
    OutputVarType_abi_cxx11_(&local_38,VarType);
  }
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Node::OutputNodeVarType(void)
{
	std::string result;

	switch(Type)
	{
	case BAS_N_STRUCTNAME:
	case BAS_N_VARTYPE:
// FIXME: This needs attention, at least lower case the bloody name.
		result = genname(TextValue);
		break;

	default:
		result = OutputVarType(GetNodeVarType());
		break;
	}

	return result;
}